

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O2

PSymbolConst * __thiscall ZCCCompiler::CompileConstant(ZCCCompiler *this,ZCC_ConstantDef *def)

{
  PClass *pPVar1;
  ZCC_Expression *node;
  PClass *pPVar2;
  PClass *pPVar3;
  PSymbolConstString *this_00;
  char *msg;
  FName local_30;
  FName local_2c;
  FName local_28;
  FName local_24;
  
  if (def->Symbol != (PSymbolConst *)0x0) {
    __assert_fail("def->Symbol == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                  ,0xbb,"PSymbolConst *ZCCCompiler::CompileConstant(ZCC_ConstantDef *)");
  }
  def->Symbol = (PSymbolConst *)0x1;
  node = Simplify(this,def->Value);
  def->Value = node;
  pPVar3 = PInt::RegistrationInfo.MyClass;
  if ((node->super_ZCC_TreeNode).NodeType == AST_ExprConstant) {
    if (node->Type == (PType *)TypeString) {
      this_00 = (PSymbolConstString *)DObject::operator_new(0x38);
      local_24.Index = (def->super_ZCC_NamedNode).NodeName;
      PSymbolConstString::PSymbolConstString
                (this_00,&local_24,(FString *)node[1].super_ZCC_TreeNode.SiblingNext);
    }
    else {
      pPVar2 = DObject::GetClass(&node->Type->super_DObject);
      pPVar1 = PFloat::RegistrationInfo.MyClass;
      if (pPVar2 == pPVar3) {
        this_00 = (PSymbolConstString *)DObject::operator_new(0x38);
        local_28.Index = (def->super_ZCC_NamedNode).NodeName;
        PSymbolConstNumeric::PSymbolConstNumeric
                  ((PSymbolConstNumeric *)this_00,&local_28,node->Type,
                   *(int *)&node[1].super_ZCC_TreeNode.SiblingNext);
      }
      else {
        pPVar3 = DObject::GetClass(&node->Type->super_DObject);
        if (pPVar3 != pPVar1) {
          node = def->Value;
          msg = "Bad type for constant definiton";
          goto LAB_00602c59;
        }
        this_00 = (PSymbolConstString *)DObject::operator_new(0x38);
        local_2c.Index = (def->super_ZCC_NamedNode).NodeName;
        PSymbolConstNumeric::PSymbolConstNumeric
                  ((PSymbolConstNumeric *)this_00,&local_2c,node->Type,
                   (double)node[1].super_ZCC_TreeNode.SiblingNext);
      }
    }
    if (this_00 != (PSymbolConstString *)0x0) goto LAB_00602d11;
  }
  else {
    msg = "Constant definition requires a constant value";
LAB_00602c59:
    Error(this,&node->super_ZCC_TreeNode,msg);
  }
  this_00 = (PSymbolConstString *)DObject::operator_new(0x38);
  local_30.Index = (def->super_ZCC_NamedNode).NodeName;
  PSymbolConstNumeric::PSymbolConstNumeric
            ((PSymbolConstNumeric *)this_00,&local_30,&TypeError->super_PType,0);
LAB_00602d11:
  def->Symbol = &this_00->super_PSymbolConst;
  PSymbolTable::ReplaceSymbol(this->Symbols,(PSymbol *)this_00);
  return &this_00->super_PSymbolConst;
}

Assistant:

PSymbolConst *ZCCCompiler::CompileConstant(ZCC_ConstantDef *def)
{
	assert(def->Symbol == NULL);

	def->Symbol = DEFINING_CONST;	// avoid recursion
	ZCC_Expression *val = Simplify(def->Value);
	def->Value = val;
	PSymbolConst *sym = NULL;
	if (val->NodeType == AST_ExprConstant)
	{
		ZCC_ExprConstant *cval = static_cast<ZCC_ExprConstant *>(val);
		if (cval->Type == TypeString)
		{
			sym = new PSymbolConstString(def->NodeName, *(cval->StringVal));
		}
		else if (cval->Type->IsA(RUNTIME_CLASS(PInt)))
		{
			sym = new PSymbolConstNumeric(def->NodeName, cval->Type, cval->IntVal);
		}
		else if (cval->Type->IsA(RUNTIME_CLASS(PFloat)))
		{
			sym = new PSymbolConstNumeric(def->NodeName, cval->Type, cval->DoubleVal);
		}
		else
		{
			Error(def->Value, "Bad type for constant definiton");
		}
	}
	else
	{
		Error(def->Value, "Constant definition requires a constant value");
	}
	if (sym == NULL)
	{
		// Create a dummy constant so we don't make any undefined value warnings.
		sym = new PSymbolConstNumeric(def->NodeName, TypeError, 0);
	}
	def->Symbol = sym;
	Symbols->ReplaceSymbol(sym);
	return sym;
}